

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::ParseOneMapEntry
                 (NodeBase *node,char *ptr,ParseContext *ctx,FieldAux *aux,TcParseTableBase *table,
                 FieldEntry *entry,Arena *arena)

{
  char *pcVar1;
  byte bVar2;
  ushort uVar3;
  undefined4 uVar4;
  ulong uVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  bool bVar8;
  char cVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  uint32_t res;
  uint extraout_EDX;
  pointer pcVar13;
  byte bVar14;
  ulong uVar15;
  pointer pcVar16;
  ulong uVar17;
  string *s;
  pair<const_char_*,_int> pVar18;
  string_view sVar19;
  pair<const_char_*,_unsigned_int> pVar20;
  string_view message_name;
  string_view field_name;
  undefined1 in_stack_ffffffffffffff78;
  MapTypeCard local_81;
  byte *local_80;
  uint local_74;
  uint local_70;
  uint local_6c;
  char *local_68;
  TcParseTableBase *local_60;
  FieldEntry *local_58;
  ulong local_50;
  NodeBase *local_48;
  
  uVar5 = *(ulong *)&aux->enum_range;
  local_80 = (byte *)ptr;
  local_60 = table;
  local_58 = entry;
  local_48 = node;
  bVar8 = EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_80,ctx->group_depth_);
  if (!bVar8) {
    bVar14 = (byte)uVar5 & 7 | 8;
    local_6c = (uint)bVar14;
    local_74 = (uint)((byte)(uVar5 >> 8) & 7 | 0x10);
    local_70 = (uint)(uVar5 >> 0x10) & 0xffff;
    local_50 = uVar5 >> 0x20 & 0xffff;
    local_68 = (char *)0x0;
    do {
      bVar10 = *local_80;
      if ((bVar14 != bVar10) && ((byte)local_74 != bVar10)) {
        auVar7[8] = bVar10;
        auVar7._0_8_ = local_80 + 1;
        auVar7._9_3_ = 0;
        if ((char)bVar10 < '\0') {
          bVar2 = local_80[1];
          res = ((uint)bVar10 + (uint)bVar2 * 0x80) - 0x80;
          if ((char)bVar2 < '\0') {
            pVar20 = ReadTagFallback((char *)local_80,res);
            auVar7 = pVar20._0_12_;
          }
          else {
            auVar7._8_4_ = res;
            auVar7._0_8_ = local_80 + 2;
          }
        }
        uVar11 = auVar7._8_4_;
        local_80 = auVar7._0_8_;
        if ((uVar11 == local_6c) || (uVar11 == local_74)) goto LAB_00155777;
        if (local_80 == (byte *)0x0) {
          return local_68;
        }
        if ((uVar11 == 0) || ((uVar11 & 7) == 4)) goto LAB_00155b56;
        local_80 = (byte *)UnknownFieldParse(uVar11,(string *)0x0,(char *)local_80,ctx);
LAB_00155888:
        if (local_80 == (byte *)0x0) {
          return local_68;
        }
        goto LAB_00155847;
      }
      uVar11 = (uint)(char)bVar10;
      local_80 = local_80 + 1;
LAB_00155777:
      uVar17 = local_50;
      uVar12 = (uint)(uVar5 >> 8);
      if (uVar11 == local_6c) {
        uVar17 = 8;
        uVar12 = (uint)uVar5;
      }
      local_81.data_ = (uint8_t)uVar12;
      if (5 < (local_81.data_ & 7)) {
switchD_001557bd_caseD_3:
        ParseOneMapEntry();
LAB_00155b51:
        ParseOneMapEntry();
        uVar11 = extraout_EDX;
LAB_00155b56:
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar11 - 1;
        return (char *)local_80;
      }
      s = (string *)((long)&local_48->next + uVar17);
      switch(uVar12 & 7) {
      case 0:
        pcVar16 = (pointer)(long)(char)*local_80;
        if ((long)pcVar16 < 0) {
          uVar17 = (long)(char)local_80[1] << 7 | 0x7f;
          if ((long)uVar17 < 0) {
            uVar15 = (long)(char)local_80[2] << 0xe | 0x3fff;
            if ((long)uVar15 < 0) {
              uVar17 = uVar17 & ((long)(char)local_80[3] << 0x15 | 0x1fffffU);
              if ((long)uVar17 < 0) {
                uVar15 = uVar15 & ((long)(char)local_80[4] << 0x1c | 0xfffffffU);
                if ((long)uVar15 < 0) {
                  uVar17 = uVar17 & ((long)(char)local_80[5] << 0x23 | 0x7ffffffffU);
                  if ((long)uVar17 < 0) {
                    uVar15 = uVar15 & ((long)(char)local_80[6] << 0x2a | 0x3ffffffffffU);
                    if ((long)uVar15 < 0) {
                      uVar17 = uVar17 & ((long)(char)local_80[7] << 0x31 | 0x1ffffffffffffU);
                      if ((long)uVar17 < 0) {
                        uVar15 = uVar15 & ((ulong)local_80[8] << 0x38 | 0xffffffffffffff);
                        if ((long)uVar15 < 0) {
                          bVar10 = local_80[9];
                          local_80 = local_80 + 10;
                          if (bVar10 != 1) {
                            if ((char)bVar10 < '\0') {
                              return (char *)0x0;
                            }
                            if ((bVar10 & 1) == 0) {
                              uVar15 = uVar15 ^ 0x8000000000000000;
                            }
                          }
                        }
                        else {
                          local_80 = local_80 + 9;
                        }
                      }
                      else {
                        local_80 = local_80 + 8;
                      }
                    }
                    else {
                      local_80 = local_80 + 7;
                    }
                  }
                  else {
                    local_80 = local_80 + 6;
                  }
                }
                else {
                  local_80 = local_80 + 5;
                }
              }
              else {
                local_80 = local_80 + 4;
              }
            }
            else {
              local_80 = local_80 + 3;
            }
            uVar17 = uVar17 & uVar15;
          }
          else {
            local_80 = local_80 + 2;
          }
          pcVar16 = (pointer)((ulong)pcVar16 & uVar17);
        }
        else {
          local_80 = local_80 + 1;
        }
        bVar10 = local_81.data_ >> 3 & 7;
        uVar11 = (uint)pcVar16;
        if (bVar10 == 2) {
          bVar8 = MapTypeCard::is_zigzag(&local_81);
          pcVar13 = (pointer)(-(ulong)(uVar11 & 1) ^ (ulong)pcVar16 >> 1);
          if (!bVar8) {
            pcVar13 = pcVar16;
          }
          (s->_M_dataplus)._M_p = pcVar13;
          break;
        }
        if (bVar10 == 1) {
          bVar8 = MapTypeCard::is_zigzag(&local_81);
          uVar12 = -(uVar11 & 1) ^ (uint)((ulong)pcVar16 >> 1) & 0x7fffffff;
          if (!bVar8) {
            uVar12 = uVar11;
          }
          *(uint *)&(s->_M_dataplus)._M_p = uVar12;
          break;
        }
        if (bVar10 == 0) {
          *(bool *)&(s->_M_dataplus)._M_p = pcVar16 != (pointer)0x0;
          break;
        }
        goto LAB_00155b51;
      case 1:
        pcVar16 = *(pointer *)local_80;
        local_80 = local_80 + 8;
        (s->_M_dataplus)._M_p = pcVar16;
        break;
      case 2:
        bVar10 = local_81.data_ >> 3 & 7;
        if (bVar10 != 3) {
          if (bVar10 == 4) {
            if (uVar11 == local_74) {
              local_80 = (byte *)ParseContext::ParseMessage(ctx,(MessageLite *)s,(char *)local_80);
              goto LAB_00155888;
            }
          }
          else {
            ParseOneMapEntry();
          }
          ParseOneMapEntry();
          goto switchD_001557bd_caseD_3;
        }
        bVar10 = *local_80;
        if ((char)bVar10 < '\0') {
          pVar18 = ReadSizeFallback((char *)local_80,(uint)bVar10);
          auVar6 = pVar18._0_12_;
          local_80 = (byte *)pVar18.first;
          if (local_80 == (byte *)0x0) {
            return (char *)0x0;
          }
        }
        else {
          local_80 = local_80 + 1;
          auVar6[8] = bVar10;
          auVar6._0_8_ = local_80;
          auVar6._9_3_ = 0;
        }
        local_80 = (byte *)EpsCopyInputStream::ReadString
                                     (&ctx->super_EpsCopyInputStream,auVar6._0_8_,auVar6._8_4_,s);
        if (local_80 == (byte *)0x0) {
          return (char *)0x0;
        }
        uVar11 = local_70 & 0xc;
        bVar8 = MapTypeCard::is_utf8(&local_81);
        if ((bVar8 && uVar11 != 0) &&
           (cVar9 = utf8_range::IsStructurallyValid(s->_M_string_length,(s->_M_dataplus)._M_p),
           cVar9 == '\0')) {
          pcVar1 = (char *)((long)&local_60->has_bits_offset +
                           (ulong)local_60->num_aux_entries * 8 + (ulong)local_60->aux_offset);
          uVar3 = local_60->num_field_entries;
          cVar9 = *pcVar1;
          sVar19 = FieldName(local_60,local_58);
          message_name._M_str = (char *)sVar19._M_len;
          message_name._M_len = (size_t)(pcVar1 + (uVar3 + 8 & 0xfffffff8));
          field_name._M_str = "parsing";
          field_name._M_len = (size_t)sVar19._M_str;
          PrintUTF8ErrorLog((internal *)(long)cVar9,message_name,field_name,(char *)0x0,
                            (bool)in_stack_ffffffffffffff78);
          if ((local_70 & 4) != 0) {
            return (char *)0x0;
          }
        }
        break;
      default:
        goto switchD_001557bd_caseD_3;
      case 5:
        uVar4 = *(undefined4 *)local_80;
        local_80 = local_80 + 4;
        *(undefined4 *)&(s->_M_dataplus)._M_p = uVar4;
      }
LAB_00155847:
      bVar8 = EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_80,ctx->group_depth_);
    } while (!bVar8);
  }
  return (char *)local_80;
}

Assistant:

const char* TcParser::ParseOneMapEntry(
    NodeBase* node, const char* ptr, ParseContext* ctx,
    const TcParseTableBase::FieldAux* aux, const TcParseTableBase* table,
    const TcParseTableBase::FieldEntry& entry, Arena* arena) {
  using WFL = WireFormatLite;

  const auto map_info = aux[0].map_info;
  const uint8_t key_tag = WFL::MakeTag(1, map_info.key_type_card.wiretype());
  const uint8_t value_tag =
      WFL::MakeTag(2, map_info.value_type_card.wiretype());

  while (!ctx->Done(&ptr)) {
    uint32_t inner_tag = ptr[0];

    if (PROTOBUF_PREDICT_FALSE(inner_tag != key_tag &&
                               inner_tag != value_tag)) {
      // Do a full parse and check again in case the tag has non-canonical
      // encoding.
      ptr = ReadTag(ptr, &inner_tag);
      if (PROTOBUF_PREDICT_FALSE(inner_tag != key_tag &&
                                 inner_tag != value_tag)) {
        if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;

        if (inner_tag == 0 || (inner_tag & 7) == WFL::WIRETYPE_END_GROUP) {
          ctx->SetLastTag(inner_tag);
          break;
        }

        ptr = UnknownFieldParse(inner_tag, nullptr, ptr, ctx);
        if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
        continue;
      }
    } else {
      ++ptr;
    }

    MapTypeCard type_card;
    void* obj;
    if (inner_tag == key_tag) {
      type_card = map_info.key_type_card;
      obj = node->GetVoidKey();
    } else {
      type_card = map_info.value_type_card;
      obj = node->GetVoidValue(map_info.node_size_info);
    }

    switch (type_card.wiretype()) {
      case WFL::WIRETYPE_VARINT:
        uint64_t tmp;
        ptr = ParseVarint(ptr, &tmp);
        if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
        switch (type_card.cpp_type()) {
          case MapTypeCard::kBool:
            *reinterpret_cast<bool*>(obj) = static_cast<bool>(tmp);
            continue;
          case MapTypeCard::k32: {
            uint32_t v = static_cast<uint32_t>(tmp);
            if (type_card.is_zigzag()) v = WFL::ZigZagDecode32(v);
            memcpy(obj, &v, sizeof(v));
            continue;
          }
          case MapTypeCard::k64:
            if (type_card.is_zigzag()) tmp = WFL::ZigZagDecode64(tmp);
            memcpy(obj, &tmp, sizeof(tmp));
            continue;
          default:
            Unreachable();
        }
      case WFL::WIRETYPE_FIXED32:
        ptr = ReadFixed<uint32_t>(obj, ptr);
        continue;
      case WFL::WIRETYPE_FIXED64:
        ptr = ReadFixed<uint64_t>(obj, ptr);
        continue;
      case WFL::WIRETYPE_LENGTH_DELIMITED:
        if (type_card.cpp_type() == MapTypeCard::kString) {
          const int size = ReadSize(&ptr);
          if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
          std::string* str = reinterpret_cast<std::string*>(obj);
          ptr = ctx->ReadString(ptr, size, str);
          if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
          bool do_utf8_check = map_info.fail_on_utf8_failure;
#ifndef NDEBUG
          do_utf8_check |= map_info.log_debug_utf8_failure;
#endif
          if (type_card.is_utf8() && do_utf8_check &&
              !utf8_range::IsStructurallyValid(*str)) {
            PrintUTF8ErrorLog(MessageName(table), FieldName(table, &entry),
                              "parsing", false);
            if (map_info.fail_on_utf8_failure) {
              return nullptr;
            }
          }
          continue;
        } else {
          ABSL_DCHECK_EQ(+type_card.cpp_type(), +MapTypeCard::kMessage);
          ABSL_DCHECK_EQ(inner_tag, value_tag);
          ptr = ctx->ParseMessage(reinterpret_cast<MessageLite*>(obj), ptr);
          if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
          continue;
        }
      default:
        Unreachable();
    }
  }
  return ptr;
}